

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

Comment * soul::SourceCodeUtilities::getFileSummaryComment
                    (Comment *__return_storage_ptr__,CodeLocation *file)

{
  CodeLocation *this;
  bool local_dc;
  bool local_d9;
  CodeLocation local_b8;
  CodeLocation local_a8;
  byte local_91;
  uint local_90;
  byte local_89;
  CodeLocation local_88 [2];
  CodeLocation local_68;
  undefined1 local_58 [8];
  Comment firstComment;
  CodeLocation *file_local;
  Comment *secondComment;
  
  firstComment.range.end.location.data = (char *)file;
  CodeLocation::CodeLocation(&local_68,file);
  parseComment((Comment *)local_58,&local_68);
  CodeLocation::~CodeLocation(&local_68);
  local_89 = 0;
  local_d9 = false;
  if ((local_58[2] & 1U) != 0) {
    CodeLocation::CodeLocation(local_88,(CodeLocation *)&firstComment.range.start.location);
    local_89 = 1;
    local_d9 = isFollowedByBlankLine(local_88);
  }
  if ((local_89 & 1) != 0) {
    CodeLocation::~CodeLocation(local_88);
  }
  if (local_d9 == false) {
    if ((local_58[0] & 1U) != 0) {
      local_91 = 0;
      CodeLocation::CodeLocation(&local_a8,(CodeLocation *)&firstComment.range.start.location);
      parseComment(__return_storage_ptr__,&local_a8);
      CodeLocation::~CodeLocation(&local_a8);
      local_dc = false;
      if ((__return_storage_ptr__->isDoxygenStyle & 1U) != 0) {
        CodeLocation::CodeLocation(&local_b8,&(__return_storage_ptr__->range).end);
        local_dc = isFollowedByBlankLine(&local_b8);
        CodeLocation::~CodeLocation(&local_b8);
      }
      if (local_dc != false) {
        local_91 = 1;
      }
      local_90 = (uint)(local_dc != false);
      if ((local_91 & 1) == 0) {
        Comment::~Comment(__return_storage_ptr__);
      }
      if (local_90 != 0) goto LAB_00322707;
    }
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    memset(&__return_storage_ptr__->lines,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->lines);
    memset(&__return_storage_ptr__->range,0,0x10);
    CodeLocation::CodeLocation(&(__return_storage_ptr__->range).start);
    this = &(__return_storage_ptr__->range).end;
    memset(this,0,0x10);
    CodeLocation::CodeLocation(this);
    local_90 = 1;
  }
  else {
    Comment::Comment(__return_storage_ptr__,(Comment *)local_58);
    local_90 = 1;
  }
LAB_00322707:
  Comment::~Comment((Comment *)local_58);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::getFileSummaryComment (CodeLocation file)
{
    auto firstComment = parseComment (file);

    if (firstComment.isDoxygenStyle && isFollowedByBlankLine (firstComment.range.end))
        return firstComment;

    if (firstComment.valid)
    {
        auto secondComment = parseComment (firstComment.range.end);

        if (secondComment.isDoxygenStyle && isFollowedByBlankLine (secondComment.range.end))
            return secondComment;
    }

    return {};
}